

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigTsim.c
# Opt level: O0

Vec_Ptr_t * Aig_ManTernarySimulate(Aig_Man_t *p,int fVerbose,int fVeryVerbose)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  Aig_Tsi_t *p_00;
  Aig_Obj_t *pAVar6;
  uint *puVar7;
  Aig_Obj_t *pObj_00;
  void *Entry;
  bool local_dd;
  uint local_64;
  int nRetired;
  int nCounter;
  int Value;
  int fConstants;
  int f;
  int i;
  uint *pState;
  Aig_Obj_t *pObjLo;
  Aig_Obj_t *pObjLi;
  Aig_Obj_t *pObj;
  Vec_Ptr_t *vMap;
  Aig_Tsi_t *pTsi;
  int fVeryVerbose_local;
  int fVerbose_local;
  Aig_Man_t *p_local;
  
  p_00 = Aig_TsiStart(p);
  pAVar6 = Aig_ManConst1(p);
  Aig_ObjSetXsim(pAVar6,2);
  fConstants = 0;
  while( true ) {
    iVar2 = Aig_ManCiNum(p);
    iVar3 = Aig_ManRegNum(p);
    if (iVar2 - iVar3 <= fConstants) break;
    pAVar6 = (Aig_Obj_t *)Vec_PtrEntry(p->vCis,fConstants);
    Aig_ObjSetXsim(pAVar6,3);
    fConstants = fConstants + 1;
  }
  iVar2 = Aig_ManCiNum(p);
  iVar3 = Aig_ManRegNum(p);
  for (fConstants = iVar2 - iVar3; iVar2 = Vec_PtrSize(p->vCis), fConstants < iVar2;
      fConstants = fConstants + 1) {
    pAVar6 = (Aig_Obj_t *)Vec_PtrEntry(p->vCis,fConstants);
    Aig_ObjSetXsim(pAVar6,1);
  }
  for (Value = 0; Value < 1000; Value = Value + 1) {
    puVar7 = Aig_TsiStateNew(p_00);
    for (fConstants = 0; iVar2 = Aig_ManRegNum(p), fConstants < iVar2; fConstants = fConstants + 1)
    {
      Aig_ManLi(p,fConstants);
      pAVar6 = Aig_ManLo(p,fConstants);
      uVar5 = Aig_ObjGetXsim(pAVar6);
      if ((uVar5 & 1) != 0) {
        Abc_InfoSetBit(puVar7,fConstants << 1);
      }
      if ((uVar5 & 2) != 0) {
        Abc_InfoSetBit(puVar7,fConstants * 2 + 1);
      }
    }
    if (fVeryVerbose != 0) {
      printf("%3d : ",(ulong)(uint)Value);
      Aig_TsiStatePrint(p_00,puVar7);
    }
    iVar2 = Aig_TsiStateLookup(p_00,puVar7,p_00->nWords);
    if (iVar2 != 0) break;
    Aig_TsiStateInsert(p_00,puVar7,p_00->nWords);
    for (fConstants = 0; iVar2 = Vec_PtrSize(p->vObjs), fConstants < iVar2;
        fConstants = fConstants + 1) {
      pAVar6 = (Aig_Obj_t *)Vec_PtrEntry(p->vObjs,fConstants);
      if ((pAVar6 != (Aig_Obj_t *)0x0) && (iVar2 = Aig_ObjIsNode(pAVar6), iVar2 != 0)) {
        iVar2 = Aig_ObjGetXsimFanin0(pAVar6);
        iVar3 = Aig_ObjGetXsimFanin1(pAVar6);
        iVar2 = Aig_XsimAnd(iVar2,iVar3);
        Aig_ObjSetXsim(pAVar6,iVar2);
      }
    }
    iVar2 = Aig_ManCoNum(p);
    iVar3 = Aig_ManRegNum(p);
    for (fConstants = iVar2 - iVar3; iVar2 = Vec_PtrSize(p->vCos), fConstants < iVar2;
        fConstants = fConstants + 1) {
      pAVar6 = (Aig_Obj_t *)Vec_PtrEntry(p->vCos,fConstants);
      iVar2 = Aig_ObjGetXsimFanin0(pAVar6);
      Aig_ObjSetXsim(pAVar6,iVar2);
    }
    for (fConstants = 0; iVar2 = Aig_ManRegNum(p), fConstants < iVar2; fConstants = fConstants + 1)
    {
      pAVar6 = Aig_ManLi(p,fConstants);
      pObj_00 = Aig_ManLo(p,fConstants);
      if (Value < 300) {
        iVar2 = Aig_ObjGetXsim(pAVar6);
        Aig_ObjSetXsim(pObj_00,iVar2);
      }
      else {
        iVar2 = Aig_ObjGetXsim(pAVar6);
        iVar3 = Aig_ObjGetXsim(pObj_00);
        if (iVar2 != iVar3) {
          Aig_ObjSetXsim(pObj_00,3);
        }
      }
      Aig_ObjGetXsim(pObj_00);
    }
  }
  if (Value == 1000) {
    printf("Aig_ManTernarySimulate(): Did not reach a fixed point after %d iterations (not a bug).\n"
           ,1000);
    Aig_TsiStop(p_00);
    p_local = (Aig_Man_t *)0x0;
  }
  else {
    puVar7 = (uint *)Vec_PtrEntry(p_00->vStates,0);
    Aig_TsiStateOrAll(p_00,puVar7);
    bVar1 = false;
    iVar2 = Aig_ManRegNum(p);
    if (iVar2 << 1 == p_00->nWords << 5) {
      for (fConstants = 0; fConstants < p_00->nWords; fConstants = fConstants + 1) {
        if (puVar7[fConstants] != 0xffffffff) {
          bVar1 = true;
        }
      }
    }
    else {
      for (fConstants = 0; fConstants < p_00->nWords + -1; fConstants = fConstants + 1) {
        if (puVar7[fConstants] != 0xffffffff) {
          bVar1 = true;
        }
      }
      uVar5 = puVar7[fConstants];
      iVar2 = Aig_ManRegNum(p);
      uVar4 = Abc_InfoMask(iVar2 * 2 + (p_00->nWords + -1) * -0x20);
      if (uVar5 != uVar4) {
        bVar1 = true;
      }
    }
    if (bVar1) {
      iVar2 = Aig_ManCiNum(p);
      p_local = (Aig_Man_t *)Vec_PtrAlloc(iVar2);
      fConstants = 0;
      while( true ) {
        iVar2 = Aig_ManCiNum(p);
        iVar3 = Aig_ManRegNum(p);
        if (iVar2 - iVar3 <= fConstants) break;
        Entry = Vec_PtrEntry(p->vCis,fConstants);
        Vec_PtrPush((Vec_Ptr_t *)p_local,Entry);
        fConstants = fConstants + 1;
      }
      local_64 = 0;
      for (fConstants = 0; iVar2 = Aig_ManRegNum(p), fConstants < iVar2; fConstants = fConstants + 1
          ) {
        Aig_ManLi(p,fConstants);
        pAVar6 = Aig_ManLo(p,fConstants);
        iVar2 = Abc_InfoHasBit(puVar7,fConstants * 2 + 1);
        uVar5 = Abc_InfoHasBit(puVar7,fConstants << 1);
        uVar5 = iVar2 << 1 | uVar5;
        local_dd = uVar5 == 1 || uVar5 == 2;
        local_64 = local_dd + local_64;
        if (uVar5 == 1) {
          pAVar6 = Aig_ManConst0(p);
          Vec_PtrPush((Vec_Ptr_t *)p_local,pAVar6);
        }
        else if (uVar5 == 2) {
          pAVar6 = Aig_ManConst1(p);
          Vec_PtrPush((Vec_Ptr_t *)p_local,pAVar6);
        }
        else {
          if (uVar5 != 3) {
            __assert_fail("0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/aig/aigTsim.c"
                          ,0x1dd,"Vec_Ptr_t *Aig_ManTernarySimulate(Aig_Man_t *, int, int)");
          }
          Vec_PtrPush((Vec_Ptr_t *)p_local,pAVar6);
        }
      }
      Aig_TsiStop(p_00);
      if (fVerbose != 0) {
        printf("Detected %d constants after %d iterations of ternary simulation.\n",(ulong)local_64,
               (ulong)(uint)Value);
      }
    }
    else {
      if (fVerbose != 0) {
        printf("Detected 0 constants after %d iterations of ternary simulation.\n",
               (ulong)(uint)Value);
      }
      Aig_TsiStop(p_00);
      p_local = (Aig_Man_t *)0x0;
    }
  }
  return (Vec_Ptr_t *)p_local;
}

Assistant:

Vec_Ptr_t * Aig_ManTernarySimulate( Aig_Man_t * p, int fVerbose, int fVeryVerbose )
{
    Aig_Tsi_t * pTsi;
    Vec_Ptr_t * vMap;
    Aig_Obj_t * pObj, * pObjLi, * pObjLo;
    unsigned * pState;//, * pPrev;
    int i, f, fConstants, Value, nCounter, nRetired;
    // allocate the simulation manager
    pTsi = Aig_TsiStart( p );
    // initialize the values
    Aig_ObjSetXsim( Aig_ManConst1(p), AIG_XVS1 );
    Aig_ManForEachPiSeq( p, pObj, i )
        Aig_ObjSetXsim( pObj, AIG_XVSX );
    Aig_ManForEachLoSeq( p, pObj, i )
        Aig_ObjSetXsim( pObj, AIG_XVS0 );
    // simulate for the given number of timeframes
    for ( f = 0; f < TSI_MAX_ROUNDS; f++ )
    {
        // collect this state
        pState = Aig_TsiStateNew( pTsi );
        Aig_ManForEachLiLoSeq( p, pObjLi, pObjLo, i )
        {
            Value = Aig_ObjGetXsim(pObjLo);
            if ( Value & 1 )
                Abc_InfoSetBit( pState, 2 * i );
            if ( Value & 2 )
                Abc_InfoSetBit( pState, 2 * i + 1 );
        }

//        printf( "%d ", Aig_TsiStateCount(pTsi, pState) );
if ( fVeryVerbose )
{
printf( "%3d : ", f );
Aig_TsiStatePrint( pTsi, pState );
}
        // check if this state exists
        if ( Aig_TsiStateLookup( pTsi, pState, pTsi->nWords ) )
            break;
//        nCounter = 0;
//        Aig_ManForEachLiLoSeq( p, pObjLi, pObjLo, i )
//            nCounter += (Aig_ObjGetXsim(pObjLo) == AIG_XVS0);
//printf( "%d -> ", nCounter );
        // insert this state
        Aig_TsiStateInsert( pTsi, pState, pTsi->nWords );
        // simulate internal nodes
        Aig_ManForEachNode( p, pObj, i )
        {
            Aig_ObjSetXsim( pObj, Aig_XsimAnd(Aig_ObjGetXsimFanin0(pObj), Aig_ObjGetXsimFanin1(pObj)) );
//            printf( "%d %d    Id = %2d.  Value = %d.\n", 
//                Aig_ObjGetXsimFanin0(pObj), Aig_ObjGetXsimFanin1(pObj),
//                i, Aig_XsimAnd(Aig_ObjGetXsimFanin0(pObj), Aig_ObjGetXsimFanin1(pObj)) );
        }
        // transfer the latch values
        Aig_ManForEachLiSeq( p, pObj, i )
            Aig_ObjSetXsim( pObj, Aig_ObjGetXsimFanin0(pObj) );
        nCounter = 0;
        nRetired = 0;
        Aig_ManForEachLiLoSeq( p, pObjLi, pObjLo, i )
        {
            if ( f < TSI_ONE_SERIES )
                Aig_ObjSetXsim( pObjLo, Aig_ObjGetXsim(pObjLi) );
            else
            {
                if ( Aig_ObjGetXsim(pObjLi) != Aig_ObjGetXsim(pObjLo) )
                {
                    Aig_ObjSetXsim( pObjLo, AIG_XVSX );
                    nRetired++;
                }
            }
            nCounter += (Aig_ObjGetXsim(pObjLo) == AIG_XVS0);
        }
//        if ( nRetired )
//        printf( "Retired %d registers.\n", nRetired );

//        if ( f && (f % 1000 == 0) )
//            printf( "%d \n", f );
//printf( "%d  ", nCounter );
    }
//printf( "\n" );
    if ( f == TSI_MAX_ROUNDS )
    {
        printf( "Aig_ManTernarySimulate(): Did not reach a fixed point after %d iterations (not a bug).\n", TSI_MAX_ROUNDS );
        Aig_TsiStop( pTsi );
        return NULL;
    }
    // OR all the states
    pState = (unsigned *)Vec_PtrEntry( pTsi->vStates, 0 );
    Aig_TsiStateOrAll( pTsi, pState );
    // check if there are constants
    fConstants = 0;
    if ( 2*Aig_ManRegNum(p) == 32*pTsi->nWords )
    {
        for ( i = 0; i < pTsi->nWords; i++ )
            if ( pState[i] != ~0 )
                fConstants = 1;
    }
    else
    {
        for ( i = 0; i < pTsi->nWords - 1; i++ )
            if ( pState[i] != ~0 )
                fConstants = 1;
        if ( pState[i] != Abc_InfoMask( 2*Aig_ManRegNum(p) - 32*(pTsi->nWords-1) ) )
            fConstants = 1;
    }
    if ( fConstants == 0 )
    {
        if ( fVerbose )
        printf( "Detected 0 constants after %d iterations of ternary simulation.\n", f );
        Aig_TsiStop( pTsi );
        return NULL;
    }

    // start mapping by adding the true PIs
    vMap = Vec_PtrAlloc( Aig_ManCiNum(p) );
    Aig_ManForEachPiSeq( p, pObj, i )
        Vec_PtrPush( vMap, pObj );
    // find constant registers
    nCounter = 0;
    Aig_ManForEachLiLoSeq( p, pObjLi, pObjLo, i )
    {
        Value = (Abc_InfoHasBit( pState, 2 * i + 1 ) << 1) | Abc_InfoHasBit( pState, 2 * i );
        nCounter += (Value == 1 || Value == 2);
        if ( Value == 1 )
            Vec_PtrPush( vMap, Aig_ManConst0(p) );
        else if ( Value == 2 )
            Vec_PtrPush( vMap, Aig_ManConst1(p) );
        else if ( Value == 3 )
            Vec_PtrPush( vMap, pObjLo );
        else
            assert( 0 );
//        Aig_XsimPrint( stdout, Value );
    }
//    printf( "\n" );
    Aig_TsiStop( pTsi );
    if ( fVerbose )
    printf( "Detected %d constants after %d iterations of ternary simulation.\n", nCounter, f );
    return vMap;
}